

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.h
# Opt level: O2

void __thiscall AC3Codec::AC3Codec(AC3Codec *this)

{
  this->_vptr_AC3Codec = (_func_int **)&PTR__AC3Codec_00249c38;
  this->m_frame_size = 0;
  (this->mlp).m_channels = '\0';
  (this->mlp).m_samples = 0;
  (this->mlp).m_samplerate = 0;
  *(undefined8 *)((long)&(this->mlp).m_samplerate + 1) = 0;
  this->m_frameDuration = 0;
  this->m_mixinfoexists = false;
  this->m_isAtmos = false;
  this->m_state = stateDecodeAC3;
  this->m_waitMoreData = false;
  this->m_downconvertToAC3 = false;
  this->m_true_hd_mode = false;
  this->m_fscod = '\0';
  this->m_frmsizecod = 0;
  this->m_bsid = '\0';
  this->m_bsidBase = '\0';
  this->m_strmtyp = '\0';
  this->m_bsmod = '\0';
  *(undefined8 *)&this->m_bsidBase = 0;
  *(undefined8 *)((long)&this->m_sample_rate + 1) = 0;
  *(undefined8 *)&(this->mlp).m_subType = 0;
  *(undefined8 *)((long)&this->m_samples + 2) = 0;
  return;
}

Assistant:

AC3Codec()
        : m_fscod(0),
          m_frmsizecod(0),
          m_bsmod(0),
          m_acmod(0),
          m_halfratecod(0),
          m_sample_rate(0),
          m_frame_size(0),
          m_samples(0)
    {
        m_downconvertToAC3 = m_true_hd_mode = false;
        m_state = AC3State::stateDecodeAC3;
        m_waitMoreData = false;
        AC3Codec::setTestMode(false);
        m_frameDuration = 0;
        m_bit_rateExt = 0;
        m_bit_rate = 0;
        m_channels = 0;
        m_lfeon = 0;
        m_extChannelsExists = false;
        m_bsid = m_bsidBase = 0;
        m_strmtyp = 0;
        m_dsurmod = 0;
        m_mixinfoexists = false;
        m_isAtmos = false;
    }